

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

bool_t FilterLookupSet(nodemeta *m)

{
  if ((byte)((byte)*(uint *)m | 4) != 0x2d) {
    if ((*(uint *)m & 0xc0) != 0x40) {
      return 0;
    }
    if (*(char *)(m + 1) == '\x02') {
      return (ulong)(~(uint)m[1].Data & 1);
    }
  }
  return 1;
}

Assistant:

static bool_t FilterLookupSet(const nodemeta* m)
{
    return m->Meta==META_PARAM_SET || m->Meta==META_PARAM_EVENT ||
#if defined(CONFIG_CORECDOC)
        ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m[2].Meta != META_PARAM_DATA_FLAGS || !((int)m[2].Data & DFLAG_RDONLY)));
#else
        ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m[1].Meta != META_PARAM_DATA_FLAGS || !((int)m[1].Data & DFLAG_RDONLY)));
#endif
}